

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkMulti(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax,int fCnf,int fMulti,int fSimple,int fFactor)

{
  uint *puVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pAVar8;
  Abc_Obj_t *pAVar9;
  DdNode *n;
  ProgressBar *p_00;
  Abc_Ntk_t *pAVar10;
  uint uVar11;
  char *__assertion;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (nThresh < 0) {
      __assertion = "nThresh >= 0";
      uVar6 = 0x45;
    }
    else {
      if (1 < nFaninMax) {
        pAVar8 = pNtk;
        iVar3 = Abc_NtkGetChoiceNum(pNtk);
        iVar4 = (int)pAVar8;
        if (iVar3 != 0) {
          iVar4 = 0x6b0882;
          puts("Warning: The choice nodes in the AIG are removed by renoding.");
        }
        if (fCnf == 0) {
          if (fMulti == 0) {
            if (fSimple == 0) {
              if (fFactor == 0) {
                p = Vec_PtrAlloc(iVar4);
                for (iVar3 = 0; iVar4 = pNtk->vObjs->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkObj(pNtk,iVar3);
                  if ((pAVar7 != (Abc_Obj_t *)0x0) && ((pAVar7->field_0x14 & 0x10) != 0)) {
                    __assert_fail("pNode->fMarkA == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                                  ,0x18c,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
                  }
                }
                for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkObj(pNtk,iVar3);
                  if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
                    iVar4 = (pAVar7->vFanouts).nSize;
                    iVar5 = Abc_NodeMffcSize(pAVar7);
                    if (nThresh < (iVar4 + -1) * iVar5) {
                      pAVar7->field_0x14 = pAVar7->field_0x14 | 0x10;
                    }
                  }
                  iVar4 = pNtk->vObjs->nSize;
                }
                for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkCo(pNtk,iVar3);
                  puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                   0x14);
                  *puVar1 = *puVar1 | 0x10;
                }
                for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkObj(pNtk,iVar3);
                  if ((pAVar7 != (Abc_Obj_t *)0x0) &&
                     ((*(uint *)&pAVar7->field_0x14 & 0x1f) == 0x17)) {
                    do {
                      iVar4 = Abc_NtkMultiLimit(pAVar7,p,nFaninMax);
                    } while (iVar4 != 0);
                    if (nFaninMax < p->nSize) {
                      __assert_fail("vCone->nSize <= nFaninMax",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                                    ,0x1a9,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
                    }
                  }
                }
                Vec_PtrFree(p);
              }
              else {
                for (iVar3 = 0; iVar4 = pNtk->vObjs->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkObj(pNtk,iVar3);
                  if ((pAVar7 != (Abc_Obj_t *)0x0) && ((pAVar7->field_0x14 & 0x10) != 0)) {
                    __assert_fail("pNode->fMarkA == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                                  ,0x254,"void Abc_NtkMultiSetBoundsFactor(Abc_Ntk_t *)");
                  }
                }
                for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkObj(pNtk,iVar3);
                  if ((pAVar7 != (Abc_Obj_t *)0x0) &&
                     (uVar6 = *(uint *)&pAVar7->field_0x14, (uVar6 & 0xf) == 7)) {
                    uVar11 = 0;
                    if (1 < (pAVar7->vFanouts).nSize) {
                      iVar4 = Abc_NodeIsMuxControlType(pAVar7);
                      uVar11 = (uint)(iVar4 == 0) << 4;
                      uVar6 = *(uint *)&pAVar7->field_0x14;
                    }
                    *(uint *)&pAVar7->field_0x14 = uVar6 & 0xffffffef | uVar11;
                  }
                  iVar4 = pNtk->vObjs->nSize;
                }
                for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
                  pAVar7 = Abc_NtkCo(pNtk,iVar3);
                  puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                   0x14);
                  *puVar1 = *puVar1 | 0x10;
                }
              }
            }
            else {
              for (iVar3 = 0; iVar4 = pNtk->vObjs->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
                pAVar7 = Abc_NtkObj(pNtk,iVar3);
                if ((pAVar7 != (Abc_Obj_t *)0x0) && ((pAVar7->field_0x14 & 0x10) != 0)) {
                  __assert_fail("pNode->fMarkA == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                                ,0x23d,"void Abc_NtkMultiSetBoundsSimple(Abc_Ntk_t *)");
                }
              }
              for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
                pAVar7 = Abc_NtkObj(pNtk,iVar3);
                if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
                  *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 | 0x10;
                }
                iVar4 = pNtk->vObjs->nSize;
              }
            }
          }
          else {
            for (iVar3 = 0; iVar4 = pNtk->vObjs->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
              pAVar7 = Abc_NtkObj(pNtk,iVar3);
              if ((pAVar7 != (Abc_Obj_t *)0x0) && ((pAVar7->field_0x14 & 0x10) != 0)) {
                __assert_fail("pNode->fMarkA == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                              ,0x210,"void Abc_NtkMultiSetBoundsMulti(Abc_Ntk_t *, int)");
              }
            }
            for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
              pAVar7 = Abc_NtkObj(pNtk,iVar3);
              if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
                iVar4 = (pAVar7->vFanouts).nSize;
                iVar5 = Abc_NodeMffcSizeStop(pAVar7);
                uVar6 = *(uint *)&pAVar7->field_0x14;
                if (nThresh < (iVar4 + -1) * iVar5) {
                  uVar6 = uVar6 | 0x10;
                  *(uint *)&pAVar7->field_0x14 = uVar6;
                }
                if ((uVar6 >> 10 & 1) != 0) {
                  puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                   0x14);
                  *puVar1 = *puVar1 | 0x10;
                  uVar6 = *(uint *)&pAVar7->field_0x14;
                }
                if ((uVar6 >> 0xb & 1) != 0) {
                  puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]] +
                                   0x14);
                  *puVar1 = *puVar1 | 0x10;
                }
              }
              iVar4 = pNtk->vObjs->nSize;
            }
            for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
              pAVar7 = Abc_NtkCo(pNtk,iVar3);
              puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] + 0x14)
              ;
              *puVar1 = *puVar1 | 0x10;
            }
          }
        }
        else {
          for (iVar3 = 0; iVar4 = pNtk->vObjs->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
            pAVar7 = Abc_NtkObj(pNtk,iVar3);
            if ((pAVar7 != (Abc_Obj_t *)0x0) && ((pAVar7->field_0x14 & 0x10) != 0)) {
              __assert_fail("pNode->fMarkA == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                            ,0x1ce,"void Abc_NtkMultiSetBoundsCnf(Abc_Ntk_t *)");
            }
          }
          for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
            pAVar7 = Abc_NtkObj(pNtk,iVar3);
            if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
              if (1 < (pAVar7->vFanouts).nSize) {
                *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 | 0x10;
              }
              iVar4 = Abc_NodeIsMuxType(pAVar7);
              uVar6 = *(uint *)&pAVar7->field_0x14;
              if (iVar4 == 0) {
                if ((uVar6 >> 10 & 1) != 0) {
                  puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                   0x14);
                  *puVar1 = *puVar1 | 0x10;
                  uVar6 = *(uint *)&pAVar7->field_0x14;
                }
                if ((uVar6 >> 0xb & 1) == 0) goto LAB_00250ee0;
              }
              else {
                *(uint *)&pAVar7->field_0x14 = uVar6 | 0x10;
                plVar2 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
                puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x14);
                *puVar1 = *puVar1 | 0x10;
                plVar2 = (long *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]];
                puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x14);
                *puVar1 = *puVar1 | 0x10;
                plVar2 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
                puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)(plVar2[4] + 4) * 8) + 0x14);
                *puVar1 = *puVar1 | 0x10;
                pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]];
              }
              puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]] +
                               0x14);
              *puVar1 = *puVar1 | 0x10;
            }
LAB_00250ee0:
            iVar4 = pNtk->vObjs->nSize;
          }
          for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
            pAVar7 = Abc_NtkCo(pNtk,iVar3);
            puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] + 0x14);
            *puVar1 = *puVar1 | 0x10;
          }
          for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
            pAVar7 = Abc_NtkObj(pNtk,iVar3);
            if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
              Abc_NodeIsMuxType(pAVar7);
            }
          }
        }
        pAVar8 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
        pAVar7 = Abc_AigConst1(pNtk);
        if (0 < (pAVar7->vFanouts).nSize) {
          pAVar9 = Abc_NtkCreateNode(pAVar8);
          n = Cudd_ReadOne((DdManager *)pAVar8->pManFunc);
          (pAVar9->field_5).pData = n;
          Cudd_Ref(n);
          (pAVar7->field_6).pCopy = pAVar9;
        }
        p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
        for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
          pAVar7 = Abc_NtkCo(pNtk,iVar3);
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar3)) {
            Extra_ProgressBarUpdate_int(p_00,iVar3,(char *)0x0);
          }
          pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
          uVar6 = *(uint *)&pAVar7->field_0x14 & 0xf;
          if ((uVar6 != 2) && (uVar6 != 5)) {
            Abc_NtkMulti_rec(pAVar8,pAVar7);
          }
        }
        Extra_ProgressBarStop(p_00);
        for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
          pAVar7 = Abc_NtkObj(pNtk,iVar3);
          if (pAVar7 != (Abc_Obj_t *)0x0) {
            pAVar7->field_0x14 = pAVar7->field_0x14 & 0xef;
            (pAVar7->field_5).pData = (void *)0x0;
          }
        }
        Abc_NtkFinalize(pNtk,pAVar8);
        Abc_NtkMinimumBase(pAVar8);
        Abc_NtkLogicMakeSimpleCos(pAVar8,0);
        if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
          pAVar10 = Abc_NtkDup(pNtk->pExdc);
          pAVar8->pExdc = pAVar10;
        }
        iVar3 = Abc_NtkCheck(pAVar8);
        if (iVar3 == 0) {
          puts("Abc_NtkMulti: The network check has failed.");
          Abc_NtkDelete(pAVar8);
          pAVar8 = (Abc_Ntk_t *)0x0;
        }
        return pAVar8;
      }
      __assertion = "nFaninMax > 1";
      uVar6 = 0x46;
    }
  }
  else {
    __assertion = "Abc_NtkIsStrash(pNtk)";
    uVar6 = 0x44;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                ,uVar6,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor )
{
    Abc_Ntk_t * pNtkNew;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( nThresh >= 0 );
    assert( nFaninMax > 1 );

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the AIG are removed by renoding.\n" );

    // define the boundary
    if ( fCnf )
        Abc_NtkMultiSetBoundsCnf( pNtk );
    else if ( fMulti )
        Abc_NtkMultiSetBoundsMulti( pNtk, nThresh );
    else if ( fSimple )
        Abc_NtkMultiSetBoundsSimple( pNtk );
    else if ( fFactor )
        Abc_NtkMultiSetBoundsFactor( pNtk );
    else
        Abc_NtkMultiSetBounds( pNtk, nThresh, nFaninMax );

    // perform renoding for this boundary
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    Abc_NtkMultiInt( pNtk, pNtkNew );
    Abc_NtkFinalize( pNtk, pNtkNew );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtkNew );

    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );

    // report the number of CNF objects
    if ( fCnf )
    {
//        int nClauses = Abc_NtkGetClauseNum(pNtkNew) + 2*Abc_NtkPoNum(pNtkNew) + 2*Abc_NtkLatchNum(pNtkNew);
//        printf( "CNF variables = %d. CNF clauses = %d.\n",  Abc_NtkNodeNum(pNtkNew), nClauses );
    }
//printf( "Maximum fanin = %d.\n", Abc_NtkGetFaninMax(pNtkNew) );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMulti: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}